

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::
vector<const_pbrt::TriangleMesh_*,_pstd::pmr::polymorphic_allocator<const_pbrt::TriangleMesh_*>_>::
reserve(vector<const_pbrt::TriangleMesh_*,_pstd::pmr::polymorphic_allocator<const_pbrt::TriangleMesh_*>_>
        *this,size_t n)

{
  TriangleMesh **ppTVar1;
  iterator ppTVar2;
  ulong in_RSI;
  vector<const_pbrt::TriangleMesh_*,_pstd::pmr::polymorphic_allocator<const_pbrt::TriangleMesh_*>_>
  *in_RDI;
  int i;
  TriangleMesh **ra;
  TriangleMesh **in_stack_ffffffffffffffc8;
  polymorphic_allocator<const_pbrt::TriangleMesh_*> *in_stack_ffffffffffffffd0;
  int local_1c;
  
  if (in_RDI->nAlloc < in_RSI) {
    ppTVar1 = pmr::polymorphic_allocator<pbrt::TriangleMesh_const*>::
              allocate_object<pbrt::TriangleMesh_const*>
                        (in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8);
    for (local_1c = 0; (ulong)(long)local_1c < in_RDI->nStored; local_1c = local_1c + 1) {
      in_stack_ffffffffffffffd0 =
           (polymorphic_allocator<const_pbrt::TriangleMesh_*> *)(ppTVar1 + local_1c);
      ppTVar2 = begin(in_RDI);
      pmr::polymorphic_allocator<pbrt::TriangleMesh_const*>::
      construct<pbrt::TriangleMesh_const*,pbrt::TriangleMesh_const*>
                ((polymorphic_allocator<pbrt::TriangleMesh_const*> *)in_RDI,
                 (TriangleMesh **)in_stack_ffffffffffffffd0,ppTVar2 + local_1c);
      ppTVar2 = begin(in_RDI);
      pmr::polymorphic_allocator<pbrt::TriangleMesh_const*>::destroy<pbrt::TriangleMesh_const*>
                ((polymorphic_allocator<pbrt::TriangleMesh_const*> *)in_RDI,ppTVar2 + local_1c);
    }
    pmr::polymorphic_allocator<pbrt::TriangleMesh_const*>::
    deallocate_object<pbrt::TriangleMesh_const*>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x485c84);
    in_RDI->nAlloc = in_RSI;
    in_RDI->ptr = ppTVar1;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }